

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkSuperChoice(Abc_Ntk_t *pNtk)

{
  int iVar1;
  void *pvVar2;
  Mio_Library_t *pLib;
  Map_Man_t *p;
  Map_Man_t *pMan;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                  ,0x219,"Abc_Ntk_t *Abc_NtkSuperChoice(Abc_Ntk_t *)");
  }
  pvVar2 = Abc_FrameReadLibGen();
  if (pvVar2 == (void *)0x0) {
    printf("The current library is not available.\n");
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pvVar2 = Abc_FrameReadLibSuper();
    if ((pvVar2 == (void *)0x0) && (pvVar2 = Abc_FrameReadLibGen(), pvVar2 != (void *)0x0)) {
      pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
      Map_SuperLibDeriveFromGenlib(pLib,0);
    }
    iVar1 = Abc_NtkGetChoiceNum(pNtk);
    if (iVar1 != 0) {
      printf("Performing mapping with choices.\n");
    }
    p = Abc_NtkToMap(pNtk,-1.0,1,(float *)0x0,0);
    if (p == (Map_Man_t *)0x0) {
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      iVar1 = Map_Mapping(p);
      if (iVar1 == 0) {
        Map_ManFree(p);
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
      else {
        pNtk_local = Abc_NtkFromMapSuperChoice(p,pNtk);
        if (pNtk_local == (Abc_Ntk_t *)0x0) {
          pNtk_local = (Abc_Ntk_t *)0x0;
        }
        else {
          Map_ManFree(p);
          iVar1 = Abc_NtkCheck(pNtk_local);
          if (iVar1 == 0) {
            printf("Abc_NtkMap: The network check has failed.\n");
            Abc_NtkDelete(pNtk_local);
            pNtk_local = (Abc_Ntk_t *)0x0;
          }
        }
      }
    }
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkSuperChoice( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;

    Map_Man_t * pMan;

    assert( Abc_NtkIsStrash(pNtk) );

    // check that the library is available
    if ( Abc_FrameReadLibGen() == NULL )
    {
        printf( "The current library is not available.\n" );
        return 0;
    }

    // derive the supergate library
    if ( Abc_FrameReadLibSuper() == NULL && Abc_FrameReadLibGen() )
    {
//        printf( "A simple supergate library is derived from gate library \"%s\".\n", 
//            Mio_LibraryReadName((Mio_Library_t *)Abc_FrameReadLibGen()) );
        Map_SuperLibDeriveFromGenlib( (Mio_Library_t *)Abc_FrameReadLibGen(), 0 );
    }

    // print a warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Performing mapping with choices.\n" );

    // perform the mapping
    pMan = Abc_NtkToMap( pNtk, -1, 1, NULL, 0 );
    if ( pMan == NULL )
        return NULL;
    if ( !Map_Mapping( pMan ) )
    {
        Map_ManFree( pMan );
        return NULL;
    }

    // reconstruct the network after mapping
    pNtkNew = Abc_NtkFromMapSuperChoice( pMan, pNtk );
    if ( pNtkNew == NULL )
        return NULL;
    Map_ManFree( pMan );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkMap: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}